

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O0

void __thiscall DIS::RadioEntityType::unmarshal(RadioEntityType *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  RadioEntityType *this_local;
  
  DataStream::operator>>(dataStream,&this->_entityKind);
  DataStream::operator>>(dataStream,&this->_domain);
  DataStream::operator>>(dataStream,&this->_country);
  DataStream::operator>>(dataStream,&this->_category);
  DataStream::operator>>(dataStream,&this->_nomenclatureVersion);
  DataStream::operator>>(dataStream,&this->_nomenclature);
  return;
}

Assistant:

void RadioEntityType::unmarshal(DataStream& dataStream)
{
    dataStream >> _entityKind;
    dataStream >> _domain;
    dataStream >> _country;
    dataStream >> _category;
    dataStream >> _nomenclatureVersion;
    dataStream >> _nomenclature;
}